

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::PrepareProgram(FunctionalTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  MessageBuilder *pMVar8;
  long lVar9;
  GLint status_1;
  GLint status;
  GLint log_size;
  Shader shader [2];
  GLchar *log_text_1;
  int local_1fc;
  undefined8 local_1f8;
  int local_1ec;
  undefined8 local_1e8;
  int aiStack_1e0 [2];
  char *local_1d8;
  undefined8 uStack_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  local_1d8 = "#version 330\n\nout vec4 color;\n\nvoid main()\n{\n    color = vec4(1.0);\n}\n";
  uStack_1d0 = 0x8b30;
  local_1e8._0_4_ = 0x1b09f30;
  local_1e8._4_4_ = 0;
  aiStack_1e0[0] = 0x8b31;
  aiStack_1e0[1] = 0;
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1cbd);
  lVar9 = 0;
  do {
    if (*(long *)((long)&local_1e8 + lVar9) != 0) {
      uVar5 = (**(code **)(lVar6 + 0x3f0))(*(undefined4 *)((long)aiStack_1e0 + lVar9));
      *(undefined4 *)((long)aiStack_1e0 + lVar9 + 4) = uVar5;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x1cc6);
      (**(code **)(lVar6 + 0x10))(this->m_po,*(undefined4 *)((long)aiStack_1e0 + lVar9 + 4));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x1cca);
      (**(code **)(lVar6 + 0x12b8))
                (*(undefined4 *)((long)aiStack_1e0 + lVar9 + 4),1,
                 (char **)((long)&local_1e8 + lVar9),0);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x1cce);
      (**(code **)(lVar6 + 0x248))(*(undefined4 *)((long)aiStack_1e0 + lVar9 + 4));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x1cd2);
      local_1fc = 0;
      (**(code **)(lVar6 + 0xa70))(*(undefined4 *)((long)aiStack_1e0 + lVar9 + 4),0x8b81,&local_1fc)
      ;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x1cd7);
      if (local_1fc == 0) {
        local_1ec = 0;
        (**(code **)(lVar6 + 0xa70))(*(undefined4 *)((long)aiStack_1e0 + lVar9 + 4),0x8b84);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x1cdd);
        iVar2 = local_1ec;
        local_1f8 = (char *)operator_new__((long)local_1ec);
        (**(code **)(lVar6 + 0xa58))
                  (*(undefined4 *)((long)aiStack_1e0 + lVar9 + 4),iVar2,0,local_1f8);
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation has failed.\n",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Shader type: ",0xd);
        local_1c0.m_value = *(int *)((long)aiStack_1e0 + lVar9);
        local_1c0.m_getName = glu::getShaderTypeName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Shader compilation error log:\n",0x1e);
        pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                   "Shader source code:\n",0x14);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char **)((long)&local_1e8 + lVar9));
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        if (local_1f8 != (char *)0x0) {
          operator_delete__(local_1f8);
        }
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x1cee);
        puVar7 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar7 = 0;
        __cxa_throw(puVar7,&int::typeinfo,0);
      }
    }
    lVar9 = lVar9 + 0x10;
  } while (lVar9 == 0x10);
  (**(code **)(lVar6 + 0xce8))(this->m_po);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1cf8);
  local_1f8 = (char *)((ulong)local_1f8._4_4_ << 0x20);
  (**(code **)(lVar6 + 0x9d8))(this->m_po,0x8b82);
  if ((int)local_1f8 == 1) {
    lVar9 = 0;
    do {
      if (*(int *)((long)aiStack_1e0 + lVar9 + 4) != 0) {
        (**(code **)(lVar6 + 0x4e0))(this->m_po);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x1d06);
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar9 == 0x10);
    lVar9 = 0xc;
    do {
      if (*(int *)((long)&local_1e8 + lVar9) != 0) {
        (**(code **)(lVar6 + 0x470))();
        *(undefined4 *)((long)&local_1e8 + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar9 == 0x1c);
    if (this->m_po != 0) {
      return;
    }
    puVar7 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar7 = 0;
    __cxa_throw(puVar7,&int::typeinfo,0);
  }
  local_1fc = 0;
  (**(code **)(lVar6 + 0x9d8))(this->m_po,0x8b84);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1d10);
  iVar2 = local_1fc;
  local_1c0.m_getName = (GetNameFunc)operator_new__((long)local_1fc);
  (**(code **)(lVar6 + 0x988))(this->m_po,iVar2,0,local_1c0.m_getName);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Program linkage has failed due to:\n",0x23);
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (local_1c0.m_getName != (GetNameFunc)0x0) {
    operator_delete__(local_1c0.m_getName);
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1d1c);
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

void FunctionalTest::PrepareProgram()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { s_vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */
		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
														<< "Shader type: " << glu::getShaderTypeStr(shader[i].type)
														<< "\n"
														<< "Shader compilation error log:\n"
														<< log_text << "\n"
														<< "Shader source code:\n"
														<< shader[i].source << "\n"
														<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(m_po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(m_po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (m_po)
		{
			gl.deleteProgram(m_po);

			m_po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == m_po)
	{
		throw 0;
	}
}